

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamplingManager.h
# Opt level: O0

void __thiscall
jaegertracing::testutils::SamplingManager::addSamplingStrategy
          (SamplingManager *this,string *serviceName,Response *response)

{
  lock_guard<std::mutex> lVar1;
  mapped_type *this_00;
  lock_guard<std::mutex> local_28;
  lock_guard<std::mutex> lock;
  Response *response_local;
  string *serviceName_local;
  SamplingManager *this_local;
  
  lock._M_device = (mutex_type *)response;
  std::lock_guard<std::mutex>::lock_guard(&local_28,(mutex_type *)(this + 0x40));
  lVar1._M_device = lock._M_device;
  this_00 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jaegertracing::sampling_manager::thrift::SamplingStrategyResponse,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jaegertracing::sampling_manager::thrift::SamplingStrategyResponse>_>_>
            ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jaegertracing::sampling_manager::thrift::SamplingStrategyResponse,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jaegertracing::sampling_manager::thrift::SamplingStrategyResponse>_>_>
                          *)(this + 8),serviceName);
  jaegertracing::sampling_manager::thrift::SamplingStrategyResponse::operator=
            (this_00,(SamplingStrategyResponse *)lVar1._M_device);
  std::lock_guard<std::mutex>::~lock_guard(&local_28);
  return;
}

Assistant:

void addSamplingStrategy(const std::string& serviceName,
                             const Response& response)
    {
        std::lock_guard<std::mutex> lock(_mutex);
        _sampling[serviceName] = response;
    }